

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t sVar1;
  Scene *pSVar2;
  float *pfVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  size_t sVar32;
  bool bVar33;
  uint uVar34;
  undefined4 uVar35;
  int iVar36;
  float *vertices;
  long lVar37;
  size_t sVar38;
  ulong uVar39;
  NodeRef root;
  long lVar40;
  uint uVar41;
  NodeRef *pNVar42;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar43;
  long lVar44;
  ulong uVar45;
  float fVar46;
  vint4 ai_2;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar66;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar65;
  undefined1 in_ZMM0 [64];
  float fVar67;
  vint4 bi;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  vint4 bi_1;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  vint4 bi_3;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar96;
  float fVar101;
  float fVar102;
  vint4 bi_2;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar103;
  undefined1 auVar100 [16];
  vint4 ai;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar111;
  float fVar117;
  float fVar118;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar119;
  undefined1 auVar115 [16];
  float fVar120;
  undefined1 auVar116 [16];
  float fVar121;
  float fVar122;
  float fVar127;
  float fVar129;
  vint4 ai_1;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar126 [16];
  float fVar133;
  float fVar135;
  float fVar136;
  undefined1 auVar134 [16];
  float fVar137;
  vint4 ai_3;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [64];
  float fVar142;
  float fVar144;
  uint uVar145;
  float fVar146;
  uint uVar147;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar143;
  float fVar148;
  uint uVar149;
  uint uVar151;
  uint uVar152;
  undefined1 auVar150 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar162;
  float fVar166;
  float fVar167;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar168;
  Precalculations pre;
  undefined1 local_1a68 [8];
  float fStack_1a60;
  float fStack_1a5c;
  undefined1 local_1a48 [16];
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  RTCFilterFunctionNArguments args;
  undefined1 local_19f8 [8];
  float fStack_19f0;
  float fStack_19ec;
  undefined1 local_19e8 [16];
  RayK<4> *local_19d0;
  undefined1 local_19c8 [16];
  undefined1 local_19b8 [16];
  vbool<4> terminated;
  undefined1 local_1978 [16];
  undefined1 local_1968 [8];
  float fStack_1960;
  float fStack_195c;
  undefined1 local_1938 [8];
  float fStack_1930;
  float fStack_192c;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_18d8;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  uint local_1868;
  uint uStack_1864;
  uint uStack_1860;
  uint uStack_185c;
  uint uStack_1858;
  uint uStack_1854;
  uint uStack_1850;
  uint uStack_184c;
  undefined1 local_1848 [16];
  undefined1 local_1838 [16];
  TravRayK<4,_false> tray;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar31 = mm_lookupmask_ps._248_8_;
  uVar30 = mm_lookupmask_ps._240_8_;
  uVar29 = mm_lookupmask_ps._8_8_;
  uVar28 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar80 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar55 = vpcmpeqd_avx(auVar80,(undefined1  [16])valid_i->field_0);
    auVar53 = ZEXT816(0) << 0x40;
    auVar7 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar53,5);
    auVar62 = auVar55 & auVar7;
    if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar62[0xf] < '\0')
    {
      auVar7 = vandps_avx(auVar7,auVar55);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar138._8_4_ = 0x7fffffff;
      auVar138._0_8_ = 0x7fffffff7fffffff;
      auVar138._12_4_ = 0x7fffffff;
      auVar55 = vandps_avx(auVar138,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar123._8_4_ = 0x219392ef;
      auVar123._0_8_ = 0x219392ef219392ef;
      auVar123._12_4_ = 0x219392ef;
      auVar55 = vcmpps_avx(auVar55,auVar123,1);
      auVar62 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar123,auVar55)
      ;
      auVar55 = vandps_avx(auVar138,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar55 = vcmpps_avx(auVar55,auVar123,1);
      auVar104 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar123,auVar55
                              );
      auVar55 = vandps_avx(auVar138,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar55 = vcmpps_avx(auVar55,auVar123,1);
      auVar55 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar123,auVar55)
      ;
      auVar97 = vrcpps_avx(auVar62);
      fVar64 = auVar97._0_4_;
      auVar92._0_4_ = auVar62._0_4_ * fVar64;
      fVar65 = auVar97._4_4_;
      auVar92._4_4_ = auVar62._4_4_ * fVar65;
      fVar66 = auVar97._8_4_;
      auVar92._8_4_ = auVar62._8_4_ * fVar66;
      fVar120 = auVar97._12_4_;
      auVar92._12_4_ = auVar62._12_4_ * fVar120;
      auVar124._8_4_ = 0x3f800000;
      auVar124._0_8_ = 0x3f8000003f800000;
      auVar124._12_4_ = 0x3f800000;
      auVar62 = vsubps_avx(auVar124,auVar92);
      tray.rdir.field_0._0_4_ = fVar64 + fVar64 * auVar62._0_4_;
      tray.rdir.field_0._4_4_ = fVar65 + fVar65 * auVar62._4_4_;
      tray.rdir.field_0._8_4_ = fVar66 + fVar66 * auVar62._8_4_;
      tray.rdir.field_0._12_4_ = fVar120 + fVar120 * auVar62._12_4_;
      auVar62 = vrcpps_avx(auVar104);
      fVar64 = auVar62._0_4_;
      auVar97._0_4_ = auVar104._0_4_ * fVar64;
      fVar65 = auVar62._4_4_;
      auVar97._4_4_ = auVar104._4_4_ * fVar65;
      fVar66 = auVar62._8_4_;
      auVar97._8_4_ = auVar104._8_4_ * fVar66;
      fVar120 = auVar62._12_4_;
      auVar97._12_4_ = auVar104._12_4_ * fVar120;
      auVar62 = vsubps_avx(auVar124,auVar97);
      tray.rdir.field_0._16_4_ = fVar64 + fVar64 * auVar62._0_4_;
      tray.rdir.field_0._20_4_ = fVar65 + fVar65 * auVar62._4_4_;
      tray.rdir.field_0._24_4_ = fVar66 + fVar66 * auVar62._8_4_;
      tray.rdir.field_0._28_4_ = fVar120 + fVar120 * auVar62._12_4_;
      auVar62 = vrcpps_avx(auVar55);
      fVar64 = auVar62._0_4_;
      auVar104._0_4_ = auVar55._0_4_ * fVar64;
      fVar65 = auVar62._4_4_;
      auVar104._4_4_ = auVar55._4_4_ * fVar65;
      fVar66 = auVar62._8_4_;
      auVar104._8_4_ = auVar55._8_4_ * fVar66;
      fVar120 = auVar62._12_4_;
      auVar104._12_4_ = auVar55._12_4_ * fVar120;
      auVar55 = vsubps_avx(auVar124,auVar104);
      tray.rdir.field_0._32_4_ = fVar64 + fVar64 * auVar55._0_4_;
      tray.rdir.field_0._36_4_ = fVar65 + fVar65 * auVar55._4_4_;
      tray.rdir.field_0._40_4_ = fVar66 + fVar66 * auVar55._8_4_;
      tray.rdir.field_0._44_4_ = fVar120 + fVar120 * auVar55._12_4_;
      auVar55 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar53,1);
      auVar112._8_4_ = 0x10;
      auVar112._0_8_ = 0x1000000010;
      auVar112._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar55,auVar112);
      auVar55 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar53,5);
      auVar62._8_4_ = 0x20;
      auVar62._0_8_ = 0x2000000020;
      auVar62._12_4_ = 0x20;
      auVar113._8_4_ = 0x30;
      auVar113._0_8_ = 0x3000000030;
      auVar113._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar113,auVar62,auVar55)
      ;
      auVar55 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar53,5);
      auVar105._8_4_ = 0x40;
      auVar105._0_8_ = 0x4000000040;
      auVar105._12_4_ = 0x40;
      auVar114._8_4_ = 0x50;
      auVar114._0_8_ = 0x5000000050;
      auVar114._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar114,auVar105,auVar55);
      auVar55 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar53);
      auVar62 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar53);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar141 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar55,auVar7);
      auVar82 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar55._8_4_ = 0xff800000;
      auVar55._0_8_ = 0xff800000ff800000;
      auVar55._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar55,auVar62,auVar7);
      terminated.field_0.i[1] = auVar7._4_4_ ^ auVar80._4_4_;
      terminated.field_0.i[0] = auVar7._0_4_ ^ auVar80._0_4_;
      terminated.field_0.i[2] = auVar7._8_4_ ^ auVar80._8_4_;
      terminated.field_0.i[3] = auVar7._12_4_ ^ auVar80._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar41 = 3;
      }
      else {
        uVar41 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_19d0 = ray + 0x80;
      pNVar42 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar43 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_00ebe891:
      do {
        do {
          root.ptr = pNVar42[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00ebf9c4;
          pNVar42 = pNVar42 + -1;
          paVar43 = paVar43 + -1;
          aVar143 = *paVar43;
          auVar80 = vcmpps_avx((undefined1  [16])aVar143,(undefined1  [16])tray.tfar.field_0,1);
          uVar34 = vmovmskps_avx(auVar80);
        } while (uVar34 == 0);
        uVar45 = (ulong)(byte)uVar34;
        if (uVar41 < (uint)POPCOUNT(uVar34 & 0xff)) {
LAB_00ebe8d2:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00ebf9c4;
              auVar80 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar143,6);
              if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar80 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar80 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar80[0xf]) goto LAB_00ebe891;
              auVar80 = vpcmpeqd_avx(auVar80,auVar80);
              lVar40 = (root.ptr & 0xfffffffffffffff0) + 0x50;
              lVar37 = 0;
              local_1978 = auVar80 ^ (undefined1  [16])terminated.field_0;
              goto LAB_00ebeab9;
            }
            sVar38 = 8;
            aVar143 = auVar141._0_16_;
            for (lVar37 = 0;
                (lVar37 != 4 &&
                (sVar1 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar37 * 8), sVar1 != 8));
                lVar37 = lVar37 + 1) {
              uVar35 = *(undefined4 *)(root.ptr + 0x20 + lVar37 * 4);
              auVar47._4_4_ = uVar35;
              auVar47._0_4_ = uVar35;
              auVar47._8_4_ = uVar35;
              auVar47._12_4_ = uVar35;
              auVar22._8_8_ = tray.org.field_0._8_8_;
              auVar22._0_8_ = tray.org.field_0._0_8_;
              auVar23._8_8_ = tray.org.field_0._24_8_;
              auVar23._0_8_ = tray.org.field_0._16_8_;
              auVar24._8_8_ = tray.org.field_0._40_8_;
              auVar24._0_8_ = tray.org.field_0._32_8_;
              auVar80 = vsubps_avx(auVar47,auVar22);
              auVar106._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar80._0_4_;
              auVar106._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar80._4_4_;
              auVar106._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar80._8_4_;
              auVar106._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar80._12_4_;
              uVar35 = *(undefined4 *)(root.ptr + 0x40 + lVar37 * 4);
              auVar48._4_4_ = uVar35;
              auVar48._0_4_ = uVar35;
              auVar48._8_4_ = uVar35;
              auVar48._12_4_ = uVar35;
              auVar80 = vsubps_avx(auVar48,auVar23);
              auVar125._0_4_ = tray.rdir.field_0._16_4_ * auVar80._0_4_;
              auVar125._4_4_ = tray.rdir.field_0._20_4_ * auVar80._4_4_;
              auVar125._8_4_ = tray.rdir.field_0._24_4_ * auVar80._8_4_;
              auVar125._12_4_ = tray.rdir.field_0._28_4_ * auVar80._12_4_;
              uVar35 = *(undefined4 *)(root.ptr + 0x60 + lVar37 * 4);
              auVar49._4_4_ = uVar35;
              auVar49._0_4_ = uVar35;
              auVar49._8_4_ = uVar35;
              auVar49._12_4_ = uVar35;
              auVar80 = vsubps_avx(auVar49,auVar24);
              auVar139._0_4_ = tray.rdir.field_0._32_4_ * auVar80._0_4_;
              auVar139._4_4_ = tray.rdir.field_0._36_4_ * auVar80._4_4_;
              auVar139._8_4_ = tray.rdir.field_0._40_4_ * auVar80._8_4_;
              auVar139._12_4_ = tray.rdir.field_0._44_4_ * auVar80._12_4_;
              uVar35 = *(undefined4 *)(root.ptr + 0x30 + lVar37 * 4);
              auVar50._4_4_ = uVar35;
              auVar50._0_4_ = uVar35;
              auVar50._8_4_ = uVar35;
              auVar50._12_4_ = uVar35;
              auVar80 = vsubps_avx(auVar50,auVar22);
              auVar68._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar80._0_4_;
              auVar68._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar80._4_4_;
              auVar68._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar80._8_4_;
              auVar68._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar80._12_4_;
              uVar35 = *(undefined4 *)(root.ptr + 0x50 + lVar37 * 4);
              auVar51._4_4_ = uVar35;
              auVar51._0_4_ = uVar35;
              auVar51._8_4_ = uVar35;
              auVar51._12_4_ = uVar35;
              auVar80 = vsubps_avx(auVar51,auVar23);
              auVar83._0_4_ = tray.rdir.field_0._16_4_ * auVar80._0_4_;
              auVar83._4_4_ = tray.rdir.field_0._20_4_ * auVar80._4_4_;
              auVar83._8_4_ = tray.rdir.field_0._24_4_ * auVar80._8_4_;
              auVar83._12_4_ = tray.rdir.field_0._28_4_ * auVar80._12_4_;
              uVar35 = *(undefined4 *)(root.ptr + 0x70 + lVar37 * 4);
              auVar52._4_4_ = uVar35;
              auVar52._0_4_ = uVar35;
              auVar52._8_4_ = uVar35;
              auVar52._12_4_ = uVar35;
              auVar80 = vsubps_avx(auVar52,auVar24);
              auVar93._0_4_ = tray.rdir.field_0._32_4_ * auVar80._0_4_;
              auVar93._4_4_ = tray.rdir.field_0._36_4_ * auVar80._4_4_;
              auVar93._8_4_ = tray.rdir.field_0._40_4_ * auVar80._8_4_;
              auVar93._12_4_ = tray.rdir.field_0._44_4_ * auVar80._12_4_;
              auVar80 = vpminsd_avx(auVar106,auVar68);
              auVar55 = vpminsd_avx(auVar125,auVar83);
              auVar80 = vpmaxsd_avx(auVar80,auVar55);
              auVar55 = vpminsd_avx(auVar139,auVar93);
              auVar55 = vpmaxsd_avx(auVar80,auVar55);
              auVar80 = vpmaxsd_avx(auVar106,auVar68);
              auVar62 = vpmaxsd_avx(auVar125,auVar83);
              auVar62 = vpminsd_avx(auVar80,auVar62);
              auVar80 = vpmaxsd_avx(auVar139,auVar93);
              auVar62 = vpminsd_avx(auVar62,auVar80);
              auVar80 = vpmaxsd_avx(auVar55,(undefined1  [16])tray.tnear.field_0);
              auVar62 = vpminsd_avx(auVar62,(undefined1  [16])tray.tfar.field_0);
              auVar80 = vcmpps_avx(auVar80,auVar62,2);
              auVar82 = ZEXT1664(auVar80);
              sVar32 = sVar38;
              aVar6 = aVar143;
              if (((((auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar80[0xf] < '\0') &&
                 (aVar6.v = (__m128)vblendvps_avx(auVar141._0_16_,auVar55,auVar80), sVar32 = sVar1,
                 sVar38 != 8)) {
                pNVar42->ptr = sVar38;
                pNVar42 = pNVar42 + 1;
                *paVar43 = aVar143;
                paVar43 = paVar43 + 1;
              }
              aVar143 = aVar6;
              sVar38 = sVar32;
            }
            if (sVar38 == 8) goto LAB_00ebea5b;
            auVar80 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar143,6);
            uVar35 = vmovmskps_avx(auVar80);
            root.ptr = sVar38;
          } while ((byte)uVar41 < (byte)POPCOUNT(uVar35));
          pNVar42->ptr = sVar38;
          pNVar42 = pNVar42 + 1;
          *paVar43 = aVar143;
          paVar43 = paVar43 + 1;
LAB_00ebea5b:
          iVar36 = 4;
        }
        else {
          while (uVar45 != 0) {
            sVar38 = 0;
            if (uVar45 != 0) {
              for (; (uVar45 >> sVar38 & 1) == 0; sVar38 = sVar38 + 1) {
              }
            }
            uVar45 = uVar45 & uVar45 - 1;
            auVar82 = ZEXT1664(auVar82._0_16_);
            bVar33 = occluded1(This,bvh,root,sVar38,&pre,ray,&tray,context);
            if (bVar33) {
              terminated.field_0.i[sVar38] = -1;
            }
          }
          auVar80 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar36 = 3;
          auVar141 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar80[0xf] < '\0') {
            auVar82 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar80._8_4_ = 0xff800000;
            auVar80._0_8_ = 0xff800000ff800000;
            auVar80._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar80,
                               (undefined1  [16])terminated.field_0);
            iVar36 = 2;
          }
          if (uVar41 < (uint)POPCOUNT(uVar34 & 0xff)) goto LAB_00ebe8d2;
        }
      } while (iVar36 != 3);
LAB_00ebf9c4:
      auVar7 = vandps_avx(auVar7,(undefined1  [16])terminated.field_0);
      auVar81._8_4_ = 0xff800000;
      auVar81._0_8_ = 0xff800000ff800000;
      auVar81._12_4_ = 0xff800000;
      auVar7 = vmaskmovps_avx(auVar7,auVar81);
      *(undefined1 (*) [16])local_19d0 = auVar7;
    }
  }
  return;
LAB_00ebeab9:
  do {
    auVar80 = auVar82._0_16_;
    if (lVar37 == (ulong)((uint)root.ptr & 0xf) - 8) break;
    pSVar2 = context->scene;
    lVar44 = -0x10;
    auVar82 = ZEXT1664(local_1978);
    do {
      auVar55 = auVar82._0_16_;
      if ((lVar44 == 0) || (uVar34 = *(uint *)(lVar40 + 0x10 + lVar44), uVar34 == 0xffffffff))
      break;
      uVar145 = *(uint *)(lVar40 + lVar44);
      pfVar3 = (pSVar2->vertices).items[uVar145];
      uVar45 = (ulong)*(uint *)(lVar40 + -0x40 + lVar44);
      uVar39 = (ulong)*(uint *)(lVar40 + -0x30 + lVar44);
      fVar64 = pfVar3[uVar45];
      auVar53._4_4_ = fVar64;
      auVar53._0_4_ = fVar64;
      auVar53._8_4_ = fVar64;
      auVar53._12_4_ = fVar64;
      fVar65 = pfVar3[uVar45 + 1];
      auVar69._4_4_ = fVar65;
      auVar69._0_4_ = fVar65;
      auVar69._8_4_ = fVar65;
      auVar69._12_4_ = fVar65;
      fVar66 = pfVar3[uVar45 + 2];
      auVar84._4_4_ = fVar66;
      auVar84._0_4_ = fVar66;
      auVar84._8_4_ = fVar66;
      auVar84._12_4_ = fVar66;
      local_1938._4_4_ = pfVar3[uVar39];
      local_1a68._4_4_ = pfVar3[uVar39 + 1];
      local_19f8._4_4_ = pfVar3[uVar39 + 2];
      uVar45 = (ulong)*(uint *)(lVar40 + -0x10 + lVar44);
      local_1968._4_4_ = pfVar3[uVar45];
      fVar120 = pfVar3[uVar45 + 1];
      fVar46 = pfVar3[uVar45 + 2];
      local_1938._0_4_ = local_1938._4_4_;
      fStack_1930 = (float)local_1938._4_4_;
      fStack_192c = (float)local_1938._4_4_;
      fVar155 = fVar64 - (float)local_1938._4_4_;
      local_1a68._0_4_ = local_1a68._4_4_;
      fStack_1a60 = (float)local_1a68._4_4_;
      fStack_1a5c = (float)local_1a68._4_4_;
      fVar67 = fVar65 - (float)local_1a68._4_4_;
      local_19f8._0_4_ = local_19f8._4_4_;
      fStack_19f0 = (float)local_19f8._4_4_;
      fStack_19ec = (float)local_19f8._4_4_;
      fVar16 = fVar66 - (float)local_19f8._4_4_;
      fVar65 = fVar120 - fVar65;
      fVar66 = fVar46 - fVar66;
      local_1968._0_4_ = local_1968._4_4_;
      fStack_1960 = (float)local_1968._4_4_;
      fStack_195c = (float)local_1968._4_4_;
      fVar64 = (float)local_1968._4_4_ - fVar64;
      auVar80 = vsubps_avx(auVar53,*(undefined1 (*) [16])ray);
      auVar62 = vsubps_avx(auVar69,*(undefined1 (*) [16])(ray + 0x10));
      auVar53 = vsubps_avx(auVar84,*(undefined1 (*) [16])(ray + 0x20));
      fVar8 = *(float *)(ray + 0x50);
      fVar9 = *(float *)(ray + 0x54);
      fVar10 = *(float *)(ray + 0x58);
      fVar11 = *(float *)(ray + 0x5c);
      fVar12 = *(float *)(ray + 0x60);
      fVar13 = *(float *)(ray + 100);
      fVar14 = *(float *)(ray + 0x68);
      fVar15 = *(float *)(ray + 0x6c);
      fVar96 = auVar53._0_4_;
      auVar156._0_4_ = fVar96 * fVar8;
      fVar101 = auVar53._4_4_;
      auVar156._4_4_ = fVar101 * fVar9;
      fVar102 = auVar53._8_4_;
      auVar156._8_4_ = fVar102 * fVar10;
      fVar103 = auVar53._12_4_;
      auVar156._12_4_ = fVar103 * fVar11;
      fVar121 = auVar62._0_4_;
      auVar163._0_4_ = fVar121 * fVar12;
      fVar127 = auVar62._4_4_;
      auVar163._4_4_ = fVar127 * fVar13;
      fVar129 = auVar62._8_4_;
      auVar163._8_4_ = fVar129 * fVar14;
      fVar131 = auVar62._12_4_;
      auVar163._12_4_ = fVar131 * fVar15;
      auVar92 = vsubps_avx(auVar163,auVar156);
      fVar17 = *(float *)(ray + 0x40);
      fVar18 = *(float *)(ray + 0x44);
      fVar19 = *(float *)(ray + 0x48);
      fVar20 = *(float *)(ray + 0x4c);
      fVar111 = auVar80._0_4_;
      auVar157._0_4_ = fVar111 * fVar12;
      fVar117 = auVar80._4_4_;
      auVar157._4_4_ = fVar117 * fVar13;
      fVar118 = auVar80._8_4_;
      auVar157._8_4_ = fVar118 * fVar14;
      fVar119 = auVar80._12_4_;
      auVar157._12_4_ = fVar119 * fVar15;
      auVar164._0_4_ = fVar96 * fVar17;
      auVar164._4_4_ = fVar101 * fVar18;
      auVar164._8_4_ = fVar102 * fVar19;
      auVar164._12_4_ = fVar103 * fVar20;
      auVar105 = vsubps_avx(auVar164,auVar157);
      auVar165._0_4_ = fVar121 * fVar17;
      auVar165._4_4_ = fVar127 * fVar18;
      auVar165._8_4_ = fVar129 * fVar19;
      auVar165._12_4_ = fVar131 * fVar20;
      auVar158._0_4_ = fVar111 * fVar8;
      auVar158._4_4_ = fVar117 * fVar9;
      auVar158._8_4_ = fVar118 * fVar10;
      auVar158._12_4_ = fVar119 * fVar11;
      auVar112 = vsubps_avx(auVar158,auVar165);
      auVar80 = ZEXT416((uint)(fVar66 * fVar155 - fVar16 * fVar64));
      auVar62 = vshufps_avx(auVar80,auVar80,0);
      auVar80 = ZEXT416((uint)(fVar64 * fVar67 - fVar155 * fVar65));
      local_18d8.field_0.z.field_0 = (vfloat_impl<4>)vshufps_avx(auVar80,auVar80,0);
      auVar113 = vpermilps_avx(ZEXT416((uint)(fVar16 * fVar65 - fVar66 * fVar67)),0);
      auVar98._0_4_ = auVar113._0_4_ * fVar17 + auVar62._0_4_ * fVar8 + local_18d8._32_4_ * fVar12;
      auVar98._4_4_ = auVar113._4_4_ * fVar18 + auVar62._4_4_ * fVar9 + local_18d8._36_4_ * fVar13;
      auVar98._8_4_ = auVar113._8_4_ * fVar19 + auVar62._8_4_ * fVar10 + local_18d8._40_4_ * fVar14;
      auVar98._12_4_ =
           auVar113._12_4_ * fVar20 + auVar62._12_4_ * fVar11 + local_18d8._44_4_ * fVar15;
      auVar53 = vshufps_avx(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65),0);
      auVar104 = vshufps_avx(ZEXT416((uint)fVar66),ZEXT416((uint)fVar66),0);
      auVar97 = vshufps_avx(ZEXT416((uint)fVar64),ZEXT416((uint)fVar64),0);
      uVar45 = (ulong)*(uint *)(lVar40 + -0x20 + lVar44);
      auVar70._8_4_ = 0x80000000;
      auVar70._0_8_ = 0x8000000080000000;
      auVar70._12_4_ = 0x80000000;
      auVar80 = vandps_avx(auVar98,auVar70);
      uVar147 = auVar80._0_4_;
      auVar134._0_4_ =
           (float)(uVar147 ^
                  (uint)(auVar92._0_4_ * auVar97._0_4_ +
                        auVar105._0_4_ * auVar53._0_4_ + auVar112._0_4_ * auVar104._0_4_));
      uVar149 = auVar80._4_4_;
      auVar134._4_4_ =
           (float)(uVar149 ^
                  (uint)(auVar92._4_4_ * auVar97._4_4_ +
                        auVar105._4_4_ * auVar53._4_4_ + auVar112._4_4_ * auVar104._4_4_));
      uVar151 = auVar80._8_4_;
      auVar134._8_4_ =
           (float)(uVar151 ^
                  (uint)(auVar92._8_4_ * auVar97._8_4_ +
                        auVar105._8_4_ * auVar53._8_4_ + auVar112._8_4_ * auVar104._8_4_));
      uVar152 = auVar80._12_4_;
      auVar134._12_4_ =
           (float)(uVar152 ^
                  (uint)(auVar92._12_4_ * auVar97._12_4_ +
                        auVar105._12_4_ * auVar53._12_4_ + auVar112._12_4_ * auVar104._12_4_));
      auVar80 = vcmpps_avx(auVar134,_DAT_01f45a50,5);
      auVar53 = auVar55 & auVar80;
      fVar64 = pfVar3[uVar45];
      auVar159._4_4_ = fVar64;
      auVar159._0_4_ = fVar64;
      auVar159._8_4_ = fVar64;
      auVar159._12_4_ = fVar64;
      fVar64 = pfVar3[uVar45 + 1];
      auVar71._4_4_ = fVar64;
      auVar71._0_4_ = fVar64;
      auVar71._8_4_ = fVar64;
      auVar71._12_4_ = fVar64;
      fVar64 = pfVar3[uVar45 + 2];
      auVar99._4_4_ = fVar64;
      auVar99._0_4_ = fVar64;
      auVar99._8_4_ = fVar64;
      auVar99._12_4_ = fVar64;
      if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar53[0xf] < '\0'
         ) {
        auVar53 = vpermilps_avx(ZEXT416((uint)fVar155),0);
        auVar104 = vpermilps_avx(ZEXT416((uint)fVar67),0);
        auVar97 = vpermilps_avx(ZEXT416((uint)fVar16),0);
        auVar80 = vandps_avx(auVar80,auVar55);
        auVar115._0_4_ =
             (float)(uVar147 ^
                    (uint)(auVar53._0_4_ * auVar92._0_4_ +
                          auVar104._0_4_ * auVar105._0_4_ + auVar112._0_4_ * auVar97._0_4_));
        auVar115._4_4_ =
             (float)(uVar149 ^
                    (uint)(auVar53._4_4_ * auVar92._4_4_ +
                          auVar104._4_4_ * auVar105._4_4_ + auVar112._4_4_ * auVar97._4_4_));
        auVar115._8_4_ =
             (float)(uVar151 ^
                    (uint)(auVar53._8_4_ * auVar92._8_4_ +
                          auVar104._8_4_ * auVar105._8_4_ + auVar112._8_4_ * auVar97._8_4_));
        auVar115._12_4_ =
             (float)(uVar152 ^
                    (uint)(auVar53._12_4_ * auVar92._12_4_ +
                          auVar104._12_4_ * auVar105._12_4_ + auVar112._12_4_ * auVar97._12_4_));
        auVar53 = vcmpps_avx(auVar115,_DAT_01f45a50,5);
        auVar104 = auVar80 & auVar53;
        local_19c8 = auVar71;
        local_19b8 = auVar159;
        local_1848 = auVar113;
        local_1838 = auVar62;
        if ((((auVar104 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar104 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar104 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar104[0xf] < '\0') {
          auVar56._8_4_ = 0x7fffffff;
          auVar56._0_8_ = 0x7fffffff7fffffff;
          auVar56._12_4_ = 0x7fffffff;
          auVar104 = vandps_avx(auVar98,auVar56);
          auVar80 = vandps_avx(auVar53,auVar80);
          auVar53 = vsubps_avx(auVar104,auVar134);
          auVar53 = vcmpps_avx(auVar53,auVar115,5);
          auVar97 = auVar80 & auVar53;
          if ((((auVar97 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar97 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar97 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar97[0xf] < '\0') {
            auVar80 = vandps_avx(auVar53,auVar80);
            auVar57._0_4_ =
                 (float)(uVar147 ^
                        (uint)(fVar111 * auVar113._0_4_ +
                              fVar121 * auVar62._0_4_ + local_18d8._32_4_ * fVar96));
            auVar57._4_4_ =
                 (float)(uVar149 ^
                        (uint)(fVar117 * auVar113._4_4_ +
                              fVar127 * auVar62._4_4_ + local_18d8._36_4_ * fVar101));
            auVar57._8_4_ =
                 (float)(uVar151 ^
                        (uint)(fVar118 * auVar113._8_4_ +
                              fVar129 * auVar62._8_4_ + local_18d8._40_4_ * fVar102));
            auVar57._12_4_ =
                 (float)(uVar152 ^
                        (uint)(fVar119 * auVar113._12_4_ +
                              fVar131 * auVar62._12_4_ + local_18d8._44_4_ * fVar103));
            fVar64 = auVar104._0_4_;
            auVar75._0_4_ = fVar64 * *(float *)(ray + 0x30);
            fVar65 = auVar104._4_4_;
            auVar75._4_4_ = fVar65 * *(float *)(ray + 0x34);
            fVar66 = auVar104._8_4_;
            auVar75._8_4_ = fVar66 * *(float *)(ray + 0x38);
            fVar155 = auVar104._12_4_;
            auVar75._12_4_ = fVar155 * *(float *)(ray + 0x3c);
            auVar108._0_4_ = fVar64 * *(float *)(ray + 0x80);
            auVar108._4_4_ = fVar65 * *(float *)(ray + 0x84);
            auVar108._8_4_ = fVar66 * *(float *)(ray + 0x88);
            auVar108._12_4_ = fVar155 * *(float *)(ray + 0x8c);
            auVar53 = vcmpps_avx(auVar75,auVar57,1);
            auVar97 = vcmpps_avx(auVar57,auVar108,2);
            auVar53 = vandps_avx(auVar97,auVar53);
            auVar97 = auVar80 & auVar53;
            if ((((auVar97 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar97 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar97 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar97[0xf] < '\0') {
              auVar80 = vandps_avx(auVar53,auVar80);
              auVar53 = vcmpps_avx(auVar98,_DAT_01f45a50,4);
              auVar97 = auVar80 & auVar53;
              if ((((auVar97 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar97 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar97 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar97[0xf] < '\0') {
                auVar80 = vandps_avx(auVar53,auVar80);
                pGVar4 = (context->scene->geometries).items[uVar145].ptr;
                uVar147 = pGVar4->mask;
                auVar76._4_4_ = uVar147;
                auVar76._0_4_ = uVar147;
                auVar76._8_4_ = uVar147;
                auVar76._12_4_ = uVar147;
                auVar53 = vandps_avx(auVar76,*(undefined1 (*) [16])(ray + 0x90));
                auVar53 = vpcmpeqd_avx(auVar53,_DAT_01f45a50);
                auVar97 = auVar80 & ~auVar53;
                if ((((auVar97 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar97 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar97 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar97[0xf] < '\0') {
                  local_1a48 = vandnps_avx(auVar53,auVar80);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar80 = vrcpps_avx(auVar104);
                    fVar67 = auVar80._0_4_;
                    auVar110._0_4_ = fVar64 * fVar67;
                    fVar64 = auVar80._4_4_;
                    auVar110._4_4_ = fVar65 * fVar64;
                    fVar65 = auVar80._8_4_;
                    auVar110._8_4_ = fVar66 * fVar65;
                    fVar66 = auVar80._12_4_;
                    auVar110._12_4_ = fVar155 * fVar66;
                    auVar126._8_4_ = 0x3f800000;
                    auVar126._0_8_ = 0x3f8000003f800000;
                    auVar126._12_4_ = 0x3f800000;
                    auVar80 = vsubps_avx(auVar126,auVar110);
                    fVar67 = fVar67 + fVar67 * auVar80._0_4_;
                    fVar64 = fVar64 + fVar64 * auVar80._4_4_;
                    fVar65 = fVar65 + fVar65 * auVar80._8_4_;
                    fVar66 = fVar66 + fVar66 * auVar80._12_4_;
                    auVar95._0_4_ = auVar134._0_4_ * fVar67;
                    auVar95._4_4_ = auVar134._4_4_ * fVar64;
                    auVar95._8_4_ = auVar134._8_4_ * fVar65;
                    auVar95._12_4_ = auVar134._12_4_ * fVar66;
                    auVar80 = vminps_avx(auVar95,auVar126);
                    auVar78._0_4_ = fVar67 * auVar115._0_4_;
                    auVar78._4_4_ = fVar64 * auVar115._4_4_;
                    auVar78._8_4_ = fVar65 * auVar115._8_4_;
                    auVar78._12_4_ = fVar66 * auVar115._12_4_;
                    auVar53 = vminps_avx(auVar78,auVar126);
                    auVar104 = vsubps_avx(auVar126,auVar80);
                    auVar97 = vsubps_avx(auVar126,auVar53);
                    auVar26._8_8_ = uVar29;
                    auVar26._0_8_ = uVar28;
                    local_1888 = vblendvps_avx(auVar80,auVar104,auVar26);
                    local_1898 = vblendvps_avx(auVar53,auVar97,auVar26);
                    local_1848._0_8_ = auVar113._0_8_;
                    local_1848._8_8_ = auVar113._8_8_;
                    local_18d8._0_8_ = local_1848._0_8_;
                    local_18d8._8_8_ = local_1848._8_8_;
                    local_1838._0_8_ = auVar62._0_8_;
                    local_1838._8_8_ = auVar62._8_8_;
                    local_18d8._16_8_ = local_1838._0_8_;
                    local_18d8._24_8_ = local_1838._8_8_;
                    local_18a8 = CONCAT44(fVar64 * auVar57._4_4_,fVar67 * auVar57._0_4_);
                    uStack_18a0 = CONCAT44(fVar66 * auVar57._12_4_,fVar65 * auVar57._8_4_);
                    args.valid = (int *)&Ng;
                    args.geometryUserPtr = &t;
                    args.context = (RTCRayQueryContext *)&v;
                    args.ray = (RTCRayN *)&u;
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                    ::
                    _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                         *)&local_18d8.field_0);
                    local_1878 = vshufps_avx(ZEXT416(uVar145),ZEXT416(uVar145),0);
                    local_1888 = vpshufd_avx(ZEXT416(uVar34),0);
                    local_18d8._0_8_ = Ng.field_0._0_8_;
                    local_18d8._8_8_ = Ng.field_0._8_8_;
                    local_18d8._16_8_ = Ng.field_0._16_8_;
                    local_18d8._24_8_ = Ng.field_0._24_8_;
                    local_18a8 = u.field_0._0_8_;
                    uStack_18a0 = u.field_0._8_8_;
                    vcmpps_avx(ZEXT1632(local_1878),ZEXT1632(local_1878),0xf);
                    uStack_1864 = context->user->instID[0];
                    local_1868 = uStack_1864;
                    uStack_1860 = uStack_1864;
                    uStack_185c = uStack_1864;
                    uStack_1858 = context->user->instPrimID[0];
                    uStack_1854 = uStack_1858;
                    uStack_1850 = uStack_1858;
                    uStack_184c = uStack_1858;
                    auVar80 = *(undefined1 (*) [16])(ray + 0x80);
                    auVar62 = vblendvps_avx(auVar80,(undefined1  [16])t.field_0,local_1a48);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar62;
                    args.valid = (int *)local_19e8;
                    args.geometryUserPtr = pGVar4->userPtr;
                    args.context = context->user;
                    args.hit = (RTCHitN *)&local_18d8;
                    args.N = 4;
                    args.ray = (RTCRayN *)ray;
                    local_19e8 = local_1a48;
                    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar4->occlusionFilterN)(&args);
                    }
                    if (local_19e8 == (undefined1  [16])0x0) {
                      auVar62 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar62 = auVar62 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&args);
                      }
                      auVar53 = vpcmpeqd_avx(local_19e8,_DAT_01f45a50);
                      auVar62 = auVar53 ^ _DAT_01f46b70;
                      auVar88._8_4_ = 0xff800000;
                      auVar88._0_8_ = 0xff800000ff800000;
                      auVar88._12_4_ = 0xff800000;
                      auVar53 = vblendvps_avx(auVar88,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar53);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar53;
                    }
                    auVar62 = vpslld_avx(auVar62,0x1f);
                    local_1a48 = vpsrad_avx(auVar62,0x1f);
                    auVar80 = vblendvps_avx(auVar80,*(undefined1 (*) [16])local_19d0,auVar62);
                    *(undefined1 (*) [16])local_19d0 = auVar80;
                  }
                  auVar55 = vandnps_avx(local_1a48,auVar55);
                  auVar71 = local_19c8;
                  auVar159 = local_19b8;
                }
              }
            }
          }
        }
      }
      if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar55 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar55 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar55[0xf])
      {
        auVar141 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        break;
      }
      auVar80 = vsubps_avx(auVar159,_local_1968);
      auVar21._4_4_ = fVar120;
      auVar21._0_4_ = fVar120;
      auVar21._8_4_ = fVar120;
      auVar21._12_4_ = fVar120;
      auVar62 = vsubps_avx(auVar71,auVar21);
      auVar27._4_4_ = fVar46;
      auVar27._0_4_ = fVar46;
      auVar27._8_4_ = fVar46;
      auVar27._12_4_ = fVar46;
      auVar53 = vsubps_avx(auVar99,auVar27);
      auVar104 = vsubps_avx(_local_1938,auVar159);
      auVar97 = vsubps_avx(_local_1a68,auVar71);
      auVar92 = vsubps_avx(_local_19f8,auVar99);
      fVar64 = auVar62._0_4_;
      fVar162 = auVar92._0_4_;
      auVar54._0_4_ = fVar162 * fVar64;
      fVar46 = auVar62._4_4_;
      fVar166 = auVar92._4_4_;
      auVar54._4_4_ = fVar166 * fVar46;
      fVar8 = auVar62._8_4_;
      fVar167 = auVar92._8_4_;
      auVar54._8_4_ = fVar167 * fVar8;
      fVar12 = auVar62._12_4_;
      fVar168 = auVar92._12_4_;
      auVar54._12_4_ = fVar168 * fVar12;
      fVar65 = auVar53._0_4_;
      fVar142 = auVar97._0_4_;
      auVar72._0_4_ = fVar142 * fVar65;
      fVar155 = auVar53._4_4_;
      fVar144 = auVar97._4_4_;
      auVar72._4_4_ = fVar144 * fVar155;
      fVar9 = auVar53._8_4_;
      fVar146 = auVar97._8_4_;
      auVar72._8_4_ = fVar146 * fVar9;
      fVar13 = auVar53._12_4_;
      fVar148 = auVar97._12_4_;
      auVar72._12_4_ = fVar148 * fVar13;
      auVar62 = vsubps_avx(auVar72,auVar54);
      fVar66 = auVar104._0_4_;
      auVar73._0_4_ = fVar65 * fVar66;
      fVar67 = auVar104._4_4_;
      auVar73._4_4_ = fVar155 * fVar67;
      fVar10 = auVar104._8_4_;
      auVar73._8_4_ = fVar9 * fVar10;
      fVar14 = auVar104._12_4_;
      auVar73._12_4_ = fVar13 * fVar14;
      fVar120 = auVar80._0_4_;
      auVar85._0_4_ = fVar162 * fVar120;
      fVar16 = auVar80._4_4_;
      auVar85._4_4_ = fVar166 * fVar16;
      fVar11 = auVar80._8_4_;
      auVar85._8_4_ = fVar167 * fVar11;
      fVar15 = auVar80._12_4_;
      auVar85._12_4_ = fVar168 * fVar15;
      auVar53 = vsubps_avx(auVar85,auVar73);
      auVar86._0_4_ = fVar142 * fVar120;
      auVar86._4_4_ = fVar144 * fVar16;
      auVar86._8_4_ = fVar146 * fVar11;
      auVar86._12_4_ = fVar148 * fVar15;
      auVar107._0_4_ = fVar66 * fVar64;
      auVar107._4_4_ = fVar67 * fVar46;
      auVar107._8_4_ = fVar10 * fVar8;
      auVar107._12_4_ = fVar14 * fVar12;
      local_18d8.field_0.z.field_0 = (vfloat_impl<4>)vsubps_avx(auVar107,auVar86);
      auVar80 = vsubps_avx(auVar159,*(undefined1 (*) [16])ray);
      auVar104 = vsubps_avx(auVar71,*(undefined1 (*) [16])(ray + 0x10));
      auVar97 = vsubps_avx(auVar99,*(undefined1 (*) [16])(ray + 0x20));
      fVar17 = *(float *)(ray + 0x50);
      fVar18 = *(float *)(ray + 0x54);
      fVar19 = *(float *)(ray + 0x58);
      fVar20 = *(float *)(ray + 0x5c);
      fVar111 = *(float *)(ray + 0x60);
      fVar117 = *(float *)(ray + 100);
      fVar118 = *(float *)(ray + 0x68);
      fVar119 = *(float *)(ray + 0x6c);
      fVar133 = auVar97._0_4_;
      auVar150._0_4_ = fVar133 * fVar17;
      fVar135 = auVar97._4_4_;
      auVar150._4_4_ = fVar135 * fVar18;
      fVar136 = auVar97._8_4_;
      auVar150._8_4_ = fVar136 * fVar19;
      fVar137 = auVar97._12_4_;
      auVar150._12_4_ = fVar137 * fVar20;
      fVar122 = auVar104._0_4_;
      auVar153._0_4_ = fVar122 * fVar111;
      fVar128 = auVar104._4_4_;
      auVar153._4_4_ = fVar128 * fVar117;
      fVar130 = auVar104._8_4_;
      auVar153._8_4_ = fVar130 * fVar118;
      fVar132 = auVar104._12_4_;
      auVar153._12_4_ = fVar132 * fVar119;
      auVar104 = vsubps_avx(auVar153,auVar150);
      fVar121 = *(float *)(ray + 0x40);
      fVar127 = *(float *)(ray + 0x44);
      fVar129 = *(float *)(ray + 0x48);
      fVar131 = *(float *)(ray + 0x4c);
      fVar96 = auVar80._0_4_;
      auVar154._0_4_ = fVar96 * fVar111;
      fVar101 = auVar80._4_4_;
      auVar154._4_4_ = fVar101 * fVar117;
      fVar102 = auVar80._8_4_;
      auVar154._8_4_ = fVar102 * fVar118;
      fVar103 = auVar80._12_4_;
      auVar154._12_4_ = fVar103 * fVar119;
      auVar160._0_4_ = fVar133 * fVar121;
      auVar160._4_4_ = fVar135 * fVar127;
      auVar160._8_4_ = fVar136 * fVar129;
      auVar160._12_4_ = fVar137 * fVar131;
      auVar97 = vsubps_avx(auVar160,auVar154);
      auVar161._0_4_ = fVar122 * fVar121;
      auVar161._4_4_ = fVar128 * fVar127;
      auVar161._8_4_ = fVar130 * fVar129;
      auVar161._12_4_ = fVar132 * fVar131;
      auVar87._0_4_ = fVar17 * fVar96;
      auVar87._4_4_ = fVar18 * fVar101;
      auVar87._8_4_ = fVar19 * fVar102;
      auVar87._12_4_ = fVar20 * fVar103;
      auVar92 = vsubps_avx(auVar87,auVar161);
      local_1938._0_4_ = auVar62._0_4_;
      local_1938._4_4_ = auVar62._4_4_;
      fStack_1930 = auVar62._8_4_;
      fStack_192c = auVar62._12_4_;
      auVar140._0_4_ =
           (float)local_1938._0_4_ * fVar121 + fVar17 * auVar53._0_4_ + local_18d8._32_4_ * fVar111;
      auVar140._4_4_ =
           (float)local_1938._4_4_ * fVar127 + fVar18 * auVar53._4_4_ + local_18d8._36_4_ * fVar117;
      auVar140._8_4_ = fStack_1930 * fVar129 + fVar19 * auVar53._8_4_ + local_18d8._40_4_ * fVar118;
      auVar140._12_4_ =
           fStack_192c * fVar131 + fVar20 * auVar53._12_4_ + local_18d8._44_4_ * fVar119;
      auVar74._8_4_ = 0x80000000;
      auVar74._0_8_ = 0x8000000080000000;
      auVar74._12_4_ = 0x80000000;
      auVar80 = vandps_avx(auVar140,auVar74);
      uVar34 = auVar80._0_4_;
      auVar94._0_4_ =
           (float)(uVar34 ^ (uint)(auVar104._0_4_ * fVar66 +
                                  fVar142 * auVar97._0_4_ + fVar162 * auVar92._0_4_));
      uVar145 = auVar80._4_4_;
      auVar94._4_4_ =
           (float)(uVar145 ^
                  (uint)(auVar104._4_4_ * fVar67 + fVar144 * auVar97._4_4_ + fVar166 * auVar92._4_4_
                        ));
      uVar147 = auVar80._8_4_;
      auVar94._8_4_ =
           (float)(uVar147 ^
                  (uint)(auVar104._8_4_ * fVar10 + fVar146 * auVar97._8_4_ + fVar167 * auVar92._8_4_
                        ));
      uVar149 = auVar80._12_4_;
      auVar94._12_4_ =
           (float)(uVar149 ^
                  (uint)(auVar104._12_4_ * fVar14 +
                        fVar148 * auVar97._12_4_ + fVar168 * auVar92._12_4_));
      auVar82 = ZEXT1664(auVar55);
      auVar80 = vcmpps_avx(auVar94,_DAT_01f45a50,5);
      auVar105 = auVar55 & auVar80;
      if ((((auVar105 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar105 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar105 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar105[0xf]
         ) {
        auVar141 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      }
      else {
        auVar80 = vandps_avx(auVar80,auVar55);
        auVar100._0_4_ =
             (float)(uVar34 ^ (uint)(auVar104._0_4_ * fVar120 +
                                    auVar97._0_4_ * fVar64 + fVar65 * auVar92._0_4_));
        auVar100._4_4_ =
             (float)(uVar145 ^
                    (uint)(auVar104._4_4_ * fVar16 +
                          auVar97._4_4_ * fVar46 + fVar155 * auVar92._4_4_));
        auVar100._8_4_ =
             (float)(uVar147 ^
                    (uint)(auVar104._8_4_ * fVar11 + auVar97._8_4_ * fVar8 + fVar9 * auVar92._8_4_))
        ;
        auVar100._12_4_ =
             (float)(uVar149 ^
                    (uint)(auVar104._12_4_ * fVar15 +
                          auVar97._12_4_ * fVar12 + fVar13 * auVar92._12_4_));
        auVar104 = vcmpps_avx(auVar100,_DAT_01f45a50,5);
        auVar97 = auVar80 & auVar104;
        if ((((auVar97 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar97 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar97 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar97[0xf] < '\0') {
          auVar58._8_4_ = 0x7fffffff;
          auVar58._0_8_ = 0x7fffffff7fffffff;
          auVar58._12_4_ = 0x7fffffff;
          auVar97 = vandps_avx(auVar140,auVar58);
          auVar80 = vandps_avx(auVar104,auVar80);
          auVar104 = vsubps_avx(auVar97,auVar94);
          auVar104 = vcmpps_avx(auVar104,auVar100,5);
          auVar92 = auVar80 & auVar104;
          if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar92 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar92[0xf] < '\0') {
            auVar80 = vandps_avx(auVar104,auVar80);
            auVar109._0_4_ =
                 (float)(uVar34 ^ (uint)((float)local_1938._0_4_ * fVar96 +
                                        fVar122 * auVar53._0_4_ + fVar133 * local_18d8._32_4_));
            auVar109._4_4_ =
                 (float)(uVar145 ^
                        (uint)((float)local_1938._4_4_ * fVar101 +
                              fVar128 * auVar53._4_4_ + fVar135 * local_18d8._36_4_));
            auVar109._8_4_ =
                 (float)(uVar147 ^
                        (uint)(fStack_1930 * fVar102 +
                              fVar130 * auVar53._8_4_ + fVar136 * local_18d8._40_4_));
            auVar109._12_4_ =
                 (float)(uVar149 ^
                        (uint)(fStack_192c * fVar103 +
                              fVar132 * auVar53._12_4_ + fVar137 * local_18d8._44_4_));
            fVar64 = auVar97._0_4_;
            auVar59._0_4_ = fVar64 * *(float *)(ray + 0x30);
            fVar65 = auVar97._4_4_;
            auVar59._4_4_ = fVar65 * *(float *)(ray + 0x34);
            fVar66 = auVar97._8_4_;
            auVar59._8_4_ = fVar66 * *(float *)(ray + 0x38);
            fVar120 = auVar97._12_4_;
            auVar59._12_4_ = fVar120 * *(float *)(ray + 0x3c);
            auVar77._0_4_ = fVar64 * *(float *)(ray + 0x80);
            auVar77._4_4_ = fVar65 * *(float *)(ray + 0x84);
            auVar77._8_4_ = fVar66 * *(float *)(ray + 0x88);
            auVar77._12_4_ = fVar120 * *(float *)(ray + 0x8c);
            auVar104 = vcmpps_avx(auVar59,auVar109,1);
            auVar92 = vcmpps_avx(auVar109,auVar77,2);
            auVar104 = vandps_avx(auVar92,auVar104);
            auVar92 = auVar80 & auVar104;
            if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar92 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar92[0xf] < '\0') {
              auVar80 = vandps_avx(auVar80,auVar104);
              auVar104 = vcmpps_avx(auVar140,_DAT_01f45a50,4);
              auVar92 = auVar80 & auVar104;
              if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar92 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar92[0xf] < '\0') {
                auVar80 = vandps_avx(auVar104,auVar80);
                uVar145 = *(uint *)(lVar40 + lVar44);
                pGVar4 = (context->scene->geometries).items[uVar145].ptr;
                uVar34 = pGVar4->mask;
                auVar60._4_4_ = uVar34;
                auVar60._0_4_ = uVar34;
                auVar60._8_4_ = uVar34;
                auVar60._12_4_ = uVar34;
                auVar104 = vandps_avx(auVar60,*(undefined1 (*) [16])(ray + 0x90));
                auVar104 = vpcmpeqd_avx(auVar104,_DAT_01f45a50);
                auVar92 = auVar80 & ~auVar104;
                if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar92 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar92[0xf] < '\0') {
                  uVar34 = *(uint *)(lVar40 + 0x10 + lVar44);
                  _local_1a68 = vandnps_avx(auVar104,auVar80);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar80 = vrcpps_avx(auVar97);
                    fVar46 = auVar80._0_4_;
                    auVar79._0_4_ = fVar64 * fVar46;
                    fVar64 = auVar80._4_4_;
                    auVar79._4_4_ = fVar65 * fVar64;
                    fVar65 = auVar80._8_4_;
                    auVar79._8_4_ = fVar66 * fVar65;
                    fVar66 = auVar80._12_4_;
                    auVar79._12_4_ = fVar120 * fVar66;
                    auVar116._8_4_ = 0x3f800000;
                    auVar116._0_8_ = 0x3f8000003f800000;
                    auVar116._12_4_ = 0x3f800000;
                    auVar80 = vsubps_avx(auVar116,auVar79);
                    fVar46 = fVar46 + fVar46 * auVar80._0_4_;
                    fVar64 = fVar64 + fVar64 * auVar80._4_4_;
                    fVar65 = fVar65 + fVar65 * auVar80._8_4_;
                    fVar66 = fVar66 + fVar66 * auVar80._12_4_;
                    auVar89._0_4_ = fVar46 * auVar94._0_4_;
                    auVar89._4_4_ = fVar64 * auVar94._4_4_;
                    auVar89._8_4_ = fVar65 * auVar94._8_4_;
                    auVar89._12_4_ = fVar66 * auVar94._12_4_;
                    auVar80 = vminps_avx(auVar89,auVar116);
                    auVar61._0_4_ = fVar46 * auVar100._0_4_;
                    auVar61._4_4_ = fVar64 * auVar100._4_4_;
                    auVar61._8_4_ = fVar65 * auVar100._8_4_;
                    auVar61._12_4_ = fVar66 * auVar100._12_4_;
                    auVar104 = vminps_avx(auVar61,auVar116);
                    auVar97 = vsubps_avx(auVar116,auVar80);
                    auVar92 = vsubps_avx(auVar116,auVar104);
                    auVar25._8_8_ = uVar31;
                    auVar25._0_8_ = uVar30;
                    local_1888 = vblendvps_avx(auVar80,auVar97,auVar25);
                    local_1898 = vblendvps_avx(auVar104,auVar92,auVar25);
                    local_18d8._0_8_ = auVar62._0_8_;
                    local_18d8._8_8_ = auVar62._8_8_;
                    local_1a38 = auVar53._0_8_;
                    uStack_1a30 = auVar53._8_8_;
                    local_18d8._16_8_ = local_1a38;
                    local_18d8._24_8_ = uStack_1a30;
                    local_18a8 = CONCAT44(fVar64 * auVar109._4_4_,fVar46 * auVar109._0_4_);
                    uStack_18a0 = CONCAT44(fVar66 * auVar109._12_4_,fVar65 * auVar109._8_4_);
                    args.valid = (int *)&Ng;
                    args.geometryUserPtr = &t;
                    args.context = (RTCRayQueryContext *)&v;
                    args.ray = (RTCRayN *)&u;
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                    ::
                    _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                         *)&local_18d8.field_0);
                    local_1878 = vpshufd_avx(ZEXT416(uVar145),0);
                    auVar80 = ZEXT416(uVar34);
                    local_1888 = vshufps_avx(auVar80,auVar80,0);
                    local_18d8._0_8_ = Ng.field_0._0_8_;
                    local_18d8._8_8_ = Ng.field_0._8_8_;
                    local_18d8._16_8_ = Ng.field_0._16_8_;
                    local_18d8._24_8_ = Ng.field_0._24_8_;
                    local_18a8 = u.field_0._0_8_;
                    uStack_18a0 = u.field_0._8_8_;
                    vcmpps_avx(ZEXT1632(local_1878),ZEXT1632(local_1878),0xf);
                    uStack_1864 = context->user->instID[0];
                    local_1868 = uStack_1864;
                    uStack_1860 = uStack_1864;
                    uStack_185c = uStack_1864;
                    uStack_1858 = context->user->instPrimID[0];
                    uStack_1854 = uStack_1858;
                    uStack_1850 = uStack_1858;
                    uStack_184c = uStack_1858;
                    auVar80 = *(undefined1 (*) [16])(ray + 0x80);
                    auVar62 = vblendvps_avx(auVar80,(undefined1  [16])t.field_0,_local_1a68);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar62;
                    args.valid = (int *)local_19e8;
                    args.geometryUserPtr = pGVar4->userPtr;
                    args.context = context->user;
                    args.hit = (RTCHitN *)&local_18d8;
                    args.N = 4;
                    args.ray = (RTCRayN *)ray;
                    local_19e8 = _local_1a68;
                    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar4->occlusionFilterN)(&args);
                    }
                    if (local_19e8 == (undefined1  [16])0x0) {
                      auVar62 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar62 = auVar62 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&args);
                      }
                      auVar53 = vpcmpeqd_avx(local_19e8,_DAT_01f45a50);
                      auVar62 = auVar53 ^ _DAT_01f46b70;
                      auVar90._8_4_ = 0xff800000;
                      auVar90._0_8_ = 0xff800000ff800000;
                      auVar90._12_4_ = 0xff800000;
                      auVar53 = vblendvps_avx(auVar90,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar53);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar53;
                    }
                    auVar62 = vpslld_avx(auVar62,0x1f);
                    _local_1a68 = vpsrad_avx(auVar62,0x1f);
                    auVar80 = vblendvps_avx(auVar80,*(undefined1 (*) [16])local_19d0,auVar62);
                    *(undefined1 (*) [16])local_19d0 = auVar80;
                  }
                  auVar80 = vandnps_avx(_local_1a68,auVar55);
                  auVar82 = ZEXT1664(auVar80);
                  auVar141 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  goto LAB_00ebee39;
                }
              }
            }
          }
        }
        auVar141 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar82 = ZEXT1664(auVar55);
      }
LAB_00ebee39:
      lVar44 = lVar44 + 4;
      auVar55 = auVar82._0_16_;
    } while ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar82[0xf] < '\0');
    auVar82 = ZEXT1664(local_1978);
    auVar62 = vandps_avx(auVar55,local_1978);
    lVar37 = lVar37 + 1;
    lVar40 = lVar40 + 0x60;
    auVar55 = local_1978 & auVar55;
    auVar80 = local_1978;
    local_1978 = auVar62;
  } while ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar55[0xf] < '\0');
  auVar80 = vpcmpeqd_avx(auVar80,auVar80);
  auVar63._0_4_ = local_1978._0_4_ ^ auVar80._0_4_;
  auVar63._4_4_ = local_1978._4_4_ ^ auVar80._4_4_;
  auVar63._8_4_ = local_1978._8_4_ ^ auVar80._8_4_;
  auVar63._12_4_ = local_1978._12_4_ ^ auVar80._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar63,(undefined1  [16])terminated.field_0);
  auVar80 = auVar80 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar80 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar80 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar80[0xf])
  goto LAB_00ebf9c4;
  auVar82 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
  auVar91._8_4_ = 0xff800000;
  auVar91._0_8_ = 0xff800000ff800000;
  auVar91._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar91,
                     (undefined1  [16])terminated.field_0);
  goto LAB_00ebe891;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }